

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyTrimEmptyElement(TidyDocImpl *doc,Node *element)

{
  uint uVar1;
  Dict *pDVar2;
  Bool BVar3;
  TidyTagId TVar4;
  Node *pNVar5;
  AttVal *pAVar6;
  
  if (*(int *)((doc->config).value + 0xf) == 0) goto LAB_0013fe32;
  BVar3 = prvTidynodeIsText(element);
  if (BVar3 != no) goto LAB_0013fdf7;
  if (((element->content != (Node *)0x0) || (pDVar2 = element->tag, pDVar2 == (Dict *)0x0)) ||
     ((uVar1 = pDVar2->model, (uVar1 & 8) != 0 && (element->attributes != (AttVal *)0x0))))
  goto LAB_0013fe32;
  TVar4 = pDVar2->id;
  if (TVar4 == TidyTag_P) {
    if (((uVar1 & 0x201) != 0) || (*(int *)((doc->config).value + 0x10) == 0)) goto LAB_0013fe32;
  }
  else if (TVar4 == TidyTag_A) {
    if (((uVar1 & 0x201) != 0) || (element->attributes != (AttVal *)0x0)) goto LAB_0013fe32;
  }
  else {
    if ((((uVar1 & 0x201) != 0) || (TVar4 == TidyTag_APPLET)) || (TVar4 == TidyTag_OBJECT))
    goto LAB_0013fe32;
    if (TVar4 == TidyTag_SCRIPT) {
      pAVar6 = prvTidyAttrGetById(element,TidyAttr_SRC);
      if (pAVar6 != (AttVal *)0x0) goto LAB_0013fe32;
      if (element->tag == (Dict *)0x0) goto LAB_0013fe8b;
      TVar4 = element->tag->id;
    }
    if (((TVar4 - TidyTag_TEXTAREA < 0x23) &&
        ((0x400020011U >> ((ulong)(TVar4 - TidyTag_TEXTAREA) & 0x3f) & 1) != 0)) ||
       (TVar4 == TidyTag_IFRAME)) goto LAB_0013fe32;
  }
LAB_0013fe8b:
  pAVar6 = prvTidyAttrGetById(element,TidyAttr_ID);
  if ((pAVar6 == (AttVal *)0x0) &&
     ((pAVar6 = prvTidyAttrGetById(element,TidyAttr_NAME), pAVar6 == (AttVal *)0x0 &&
      (pAVar6 = prvTidyAttrGetById(element,TidyAttr_DATAFLD), pAVar6 == (AttVal *)0x0)))) {
    TVar4 = element->tag->id;
    if ((int)TVar4 < 0x18) {
      if ((TVar4 != TidyTag_UNKNOWN) && (TVar4 != TidyTag_BODY)) goto LAB_0013fdf7;
    }
    else if (((TVar4 != TidyTag_COLGROUP) && (TVar4 != TidyTag_DD)) &&
            ((TVar4 != TidyTag_OPTION || (element->attributes == (AttVal *)0x0)))) {
LAB_0013fdf7:
      if (element->type != TextNode) {
        *(byte *)&doc->footnotes = (byte)doc->footnotes | 1;
        prvTidyReport(doc,element,(Node *)0x0,0x281);
      }
      pNVar5 = prvTidyDiscardElement(doc,element);
      return pNVar5;
    }
  }
LAB_0013fe32:
  return element->next;
}

Assistant:

Node *TY_(TrimEmptyElement)( TidyDocImpl* doc, Node *element )
{
    if ( CanPrune(doc, element) )
    {
        if (element->type != TextNode)
        {
            doc->footnotes |= FN_TRIM_EMPTY_ELEMENT;
            TY_(Report)(doc, element, NULL, TRIM_EMPTY_ELEMENT);
        }

        return TY_(DiscardElement)(doc, element);
    }
    return element->next;
}